

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_movs(DisasContext *s,MemOp ot)

{
  MemOp ot_local;
  DisasContext *s_local;
  
  gen_string_movl_A0_ESI(s);
  gen_op_ld_v(s,ot,s->T0,s->A0);
  gen_string_movl_A0_EDI(s);
  gen_op_st_v(s,ot,s->T0,s->A0);
  gen_op_movl_T0_Dshift(s,ot);
  gen_op_add_reg_T0(s,s->aflag,6);
  gen_op_add_reg_T0(s,s->aflag,7);
  return;
}

Assistant:

static inline void gen_movs(DisasContext *s, MemOp ot)
{
    gen_string_movl_A0_ESI(s);
    gen_op_ld_v(s, ot, s->T0, s->A0);
    gen_string_movl_A0_EDI(s);
    gen_op_st_v(s, ot, s->T0, s->A0);
    gen_op_movl_T0_Dshift(s, ot);
    gen_op_add_reg_T0(s, s->aflag, R_ESI);
    gen_op_add_reg_T0(s, s->aflag, R_EDI);
}